

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O1

void __thiscall duel::checkEnd(duel *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->field1).pile;
  uVar2 = (this->field2).pile;
  if (uVar2 < uVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player 1 wins!",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    player1Score = player1Score + 1;
  }
  else {
    if (uVar2 <= uVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Tie!",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player 2 wins!",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    player2Score = player2Score + 1;
  }
  return;
}

Assistant:

void duel::checkEnd() {
    if(field1.getPile() > field2.getPile()) {
        cout << "Player 1 wins!" << endl;
        player1Score++;
    }
    else if(field2.getPile() > field1.getPile()) {
        cout << "Player 2 wins!" << endl;
        player2Score++;
    }
    else cout << "Tie!" << endl;
}